

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O2

void __thiscall
phpconvert::ZendParser::debug
          (ZendParser *this,File *file,PreparedType *typeCopy,string *classNameLower,string *msg)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar1 = std::__cxx11::string::find((char *)&file->fullPath,0x12a2bc);
  if (lVar1 != -1) {
    std::operator+(&local_50,&file->fullPath,&file->name);
    std::operator+(&local_130,&local_50,", type full: ");
    std::operator+(&local_110,&local_130,&typeCopy->type);
    std::operator+(&local_f0,&local_110,", classname: ");
    std::operator+(&local_d0,&local_f0,classNameLower);
    std::operator+(&local_b0,&local_d0,", ");
    std::operator+(&local_90,&local_b0,msg);
    std::operator+(&local_70,&local_90,"\n");
    std::operator<<((ostream *)&std::cout,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void ZendParser::debug(const BaseParser::File &file, const PreparedType &typeCopy, const string &classNameLower,
                           string msg) const {
        if (file.fullPath.find("Zend/Paginator/Exception") != std::string::npos)
            cout << file.fullPath + file.name + ", type full: " + typeCopy.type + ", classname: " + classNameLower +
                    ", " + msg + "\n";
    }